

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O1

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateState
          (HtmlparserCppTest *this,string *expected_state)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  HtmlparserCppTest *pHVar5;
  long lVar6;
  HtmlparserCppTest *pHVar7;
  HtmlparserCppTest *pHVar8;
  HtmlparserCppTest *pHVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char *extraout_RAX;
  HtmlparserCppTest *this_00;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  int *piVar10;
  HtmlParser *this_01;
  const_iterator cVar11;
  mapped_type *ppHVar12;
  undefined8 extraout_RAX_02;
  undefined7 uVar13;
  ulong uVar14;
  htmlparser_ctx *phVar15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  HtmlparserCppTest *pHVar18;
  htmlparser_ctx_s *phVar19;
  _Base_ptr p_Var20;
  _Base_ptr p_Var21;
  pointer this_02;
  _Base_ptr unaff_R12;
  string *unaff_R14;
  pointer str_00;
  _Base_ptr unaff_R15;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_248;
  _Base_ptr p_Stack_230;
  _Base_ptr p_Stack_228;
  undefined1 auStack_1e8 [16];
  _Base_ptr p_Stack_1d8;
  HtmlparserCppTest *pHStack_1d0;
  _Base_ptr p_Stack_1c8;
  undefined1 auStack_1c0 [16];
  _Base_ptr p_Stack_1b0;
  HtmlparserCppTest *pHStack_1a8;
  _Base_ptr p_Stack_1a0;
  char *pcStack_198;
  HtmlParser HStack_190;
  allocator aStack_151;
  HtmlparserCppTest *pHStack_150;
  size_t sStack_148;
  HtmlparserCppTest HStack_140;
  HtmlparserCppTest *pHStack_100;
  ulong uStack_f8;
  HtmlparserCppTest *pHStack_e8;
  allocator aStack_d1;
  HtmlparserCppTest *pHStack_d0;
  size_t sStack_c8;
  undefined1 auStack_c0 [40];
  HtmlparserCppTest *pHStack_98;
  HtmlParser HStack_90;
  HtmlparserCppTest HStack_88;
  string *psStack_48;
  string *psStack_40;
  allocator local_31;
  HtmlparserCppTest *local_30;
  size_t local_28;
  
  pHVar18 = (HtmlparserCppTest *)(this->parser_).parser_;
  psStack_40 = (string *)0x106f3f;
  iVar4 = ctemplate_htmlparser::htmlparser_state((htmlparser_ctx_s *)pHVar18);
  puVar16 = kStateMap;
  psStack_40 = (string *)0x106f4d;
  pHVar5 = (HtmlparserCppTest *)IdToName(pHVar18,(IdNameMap *)kStateMap,iVar4);
  if (expected_state->_M_string_length == 0) {
    psStack_40 = (string *)0x106fb6;
    ValidateState();
  }
  else {
    unaff_R14 = (string *)&local_30;
    psStack_40 = (string *)0x106f69;
    std::__cxx11::string::string(unaff_R14,(char *)pHVar5,&local_31);
    sVar2 = expected_state->_M_string_length;
    puVar16 = (undefined1 *)pHVar5;
    if (sVar2 == local_28) {
      uVar13 = (undefined7)((ulong)expected_state >> 8);
      if (sVar2 == 0) {
        expected_state = (string *)CONCAT71(uVar13,1);
      }
      else {
        psStack_40 = (string *)0x106f85;
        puVar16 = (undefined1 *)local_30;
        iVar4 = bcmp((expected_state->_M_dataplus)._M_p,local_30,sVar2);
        expected_state = (string *)CONCAT71(uVar13,iVar4 == 0);
      }
    }
    else {
      expected_state = (string *)0x0;
    }
    if (local_30 != (HtmlparserCppTest *)&stack0xffffffffffffffe0) {
      psStack_40 = (string *)0x106fa5;
      operator_delete(local_30);
    }
    pHVar18 = local_30;
    if ((char)expected_state != '\0') {
      return;
    }
  }
  psStack_40 = (string *)0x106fbb;
  ValidateState();
  pHVar5 = (HtmlparserCppTest *)(pHVar18->parser_).parser_;
  HStack_88.parser_.parser_ = (htmlparser_ctx *)0x106fcf;
  pHVar7 = (HtmlparserCppTest *)puVar16;
  psStack_48 = expected_state;
  psStack_40 = unaff_R14;
  lVar6 = ctemplate_htmlparser::htmlparser_tag((htmlparser_ctx_s *)pHVar5);
  if (lVar6 == 0) {
    HStack_88.parser_.parser_ = (htmlparser_ctx *)0x106ff9;
    ValidateTag();
  }
  else {
    HStack_88.parser_.parser_ = (htmlparser_ctx *)0x106fdd;
    pHVar7 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_tag((pHVar18->parser_).parser_);
    HStack_88.parser_.parser_ = (htmlparser_ctx *)0x106fe8;
    pHVar5 = (HtmlparserCppTest *)puVar16;
    iVar4 = std::__cxx11::string::compare(puVar16);
    if (iVar4 == 0) {
      return;
    }
  }
  HStack_88.parser_.parser_ = (htmlparser_ctx *)ValidateAttribute;
  ValidateTag();
  this_00 = (HtmlparserCppTest *)(pHVar5->parser_).parser_;
  HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107011;
  pHVar8 = pHVar7;
  HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)puVar16;
  HStack_88.parser_.parser_ = (htmlparser_ctx *)pHVar18;
  lVar6 = ctemplate_htmlparser::htmlparser_attr((htmlparser_ctx_s *)this_00);
  if (lVar6 == 0) {
    HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x10703b;
    ValidateAttribute();
  }
  else {
    HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x10701f;
    pHVar8 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_attr((pHVar5->parser_).parser_);
    HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x10702a;
    this_00 = pHVar7;
    iVar4 = std::__cxx11::string::compare((char *)pHVar7);
    if (iVar4 == 0) {
      return;
    }
  }
  HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)ValidateValue;
  ValidateAttribute();
  pHVar18 = (HtmlparserCppTest *)(this_00->parser_).parser_;
  auStack_c0._24_8_ = (_Base_ptr)0x107056;
  pHVar9 = pHVar8;
  HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pHVar7;
  HStack_88.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pHVar5;
  lVar6 = ctemplate_htmlparser::htmlparser_value((htmlparser_ctx_s *)pHVar18);
  if (lVar6 != 0) {
    auStack_c0._24_8_ = (_Base_ptr)0x107064;
    pHVar9 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_value((this_00->parser_).parser_)
    ;
    this_00 = (HtmlparserCppTest *)&pHStack_98;
    auStack_c0._24_8_ = (_Base_ptr)0x107079;
    pHVar18 = this_00;
    std::__cxx11::string::string((string *)this_00,(char *)pHVar9,(allocator *)(auStack_c0 + 0x27));
    phVar15 = *(htmlparser_ctx **)&(pHVar8->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header
    ;
    if (phVar15 == HStack_90.parser_) {
      if (phVar15 == (htmlparser_ctx *)0x0) {
LAB_00107099:
        if (pHStack_98 != &HStack_88) {
          auStack_c0._24_8_ = (_Base_ptr)0x1070ac;
          operator_delete(pHStack_98);
        }
        return;
      }
      pHVar18 = *(HtmlparserCppTest **)&(pHVar8->contextMap)._M_t._M_impl;
      auStack_c0._24_8_ = (_Base_ptr)0x107095;
      pHVar9 = pHStack_98;
      iVar4 = bcmp(pHVar18,pHStack_98,(size_t)phVar15);
      if (iVar4 == 0) goto LAB_00107099;
    }
    auStack_c0._24_8_ = (_Base_ptr)0x1070b9;
    ValidateValue();
  }
  auStack_c0._24_8_ = ValidateAttributeType;
  ValidateValue();
  auStack_c0._24_8_ = this_00;
  auStack_c0._16_8_ = pHVar8;
  pHVar18 = (HtmlparserCppTest *)(pHVar18->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_attr_type((htmlparser_ctx_s *)pHVar18);
  puVar16 = kAttributeTypeMap;
  pHVar5 = (HtmlparserCppTest *)IdToName(pHVar18,(IdNameMap *)kAttributeTypeMap,iVar4);
  if (*(long *)&(pHVar9->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
    ValidateAttributeType();
  }
  else {
    this_00 = (HtmlparserCppTest *)&pHStack_d0;
    std::__cxx11::string::string((string *)this_00,(char *)pHVar5,&aStack_d1);
    sVar2 = *(size_t *)&(pHVar9->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    puVar16 = (undefined1 *)pHVar5;
    if (sVar2 == sStack_c8) {
      uVar13 = (undefined7)((ulong)pHVar9 >> 8);
      if (sVar2 == 0) {
        pHVar9 = (HtmlparserCppTest *)CONCAT71(uVar13,1);
      }
      else {
        puVar16 = (undefined1 *)pHStack_d0;
        iVar4 = bcmp(*(void **)&(pHVar9->contextMap)._M_t._M_impl,pHStack_d0,sVar2);
        pHVar9 = (HtmlparserCppTest *)CONCAT71(uVar13,iVar4 == 0);
      }
    }
    else {
      pHVar9 = (HtmlparserCppTest *)0x0;
    }
    if (pHStack_d0 != (HtmlparserCppTest *)auStack_c0) {
      operator_delete(pHStack_d0);
    }
    pHVar18 = pHStack_d0;
    if ((char)pHVar9 != '\0') {
      return;
    }
  }
  ValidateAttributeType();
  uStack_f8 = 0x10715c;
  pHStack_e8 = pHVar9;
  bVar3 = StringToBool((string *)puVar16);
  uVar14 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
  phVar19 = (pHVar18->parser_).parser_;
  uStack_f8 = 0x107167;
  iVar4 = ctemplate_htmlparser::htmlparser_is_attr_quoted(phVar19);
  if (SUB81(uVar14,0) == (iVar4 != 0)) {
    return;
  }
  uStack_f8 = 0x10717d;
  ValidateAttributeQuoted();
  HStack_140.parser_.parser_ = (htmlparser_ctx *)0x10718c;
  pHStack_100 = pHVar18;
  uStack_f8 = uVar14;
  bVar3 = StringToBool((string *)puVar16);
  phVar15 = (htmlparser_ctx *)(CONCAT71(extraout_var_00,bVar3) & 0xffffffff);
  p_Var20 = *(_Base_ptr *)(phVar19 + 0x30);
  HStack_140.parser_.parser_ = (htmlparser_ctx *)0x107197;
  iVar4 = ctemplate_htmlparser::htmlparser_in_js((htmlparser_ctx_s *)p_Var20);
  if (SUB81(phVar15,0) == (iVar4 != 0)) {
    return;
  }
  HStack_140.parser_.parser_ = (htmlparser_ctx *)0x1071ad;
  ValidateInJavascript();
  HStack_140.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071bc;
  HStack_140.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)phVar19;
  HStack_140.parser_.parser_ = phVar15;
  bVar3 = StringToBool((string *)puVar16);
  p_Var21 = p_Var20[1]._M_left;
  HStack_140.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071c7;
  iVar4 = ctemplate_htmlparser::htmlparser_is_js_quoted((htmlparser_ctx_s *)p_Var21);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  HStack_140.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071dd;
  ValidateJavascriptQuoted();
  pHVar18 = (HtmlparserCppTest *)p_Var21[1]._M_left;
  HStack_140.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var20;
  HStack_140.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)this_00;
  iVar4 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar18);
  puVar17 = kJavascriptStateMap;
  pHVar5 = (HtmlparserCppTest *)IdToName(pHVar18,(IdNameMap *)kJavascriptStateMap,iVar4);
  if (*(long *)&(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    ValidateJavascriptState();
  }
  else {
    this_00 = (HtmlparserCppTest *)&pHStack_150;
    std::__cxx11::string::string((string *)this_00,(char *)pHVar5,&aStack_151);
    sVar2 = *(size_t *)
             &(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl.super__Rb_tree_header.
              _M_header;
    puVar17 = (undefined1 *)pHVar5;
    if (sVar2 == sStack_148) {
      if (sVar2 == 0) {
        bVar3 = true;
      }
      else {
        puVar17 = (undefined1 *)pHStack_150;
        iVar4 = bcmp(*(pointer *)&(((HtmlparserCppTest *)puVar16)->contextMap)._M_t._M_impl,
                     pHStack_150,sVar2);
        bVar3 = iVar4 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (pHStack_150 != &HStack_140) {
      operator_delete(pHStack_150);
    }
    pHVar18 = pHStack_150;
    if (bVar3) {
      return;
    }
  }
  ValidateJavascriptState();
  bVar3 = StringToBool((string *)puVar17);
  p_Var20 = (_Base_ptr)(pHVar18->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)p_Var20);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateInCss();
  pHVar5 = (HtmlparserCppTest *)&pcStack_198;
  HStack_190.parser_ = (htmlparser_ctx *)pHVar18;
  if (*(long *)&(((HtmlparserCppTest *)puVar17)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar3 = false;
    p_Var21 = p_Var20;
  }
  else {
    p_Stack_1a0 = (_Base_ptr)0x1072b8;
    pcStack_198 = extraout_RAX;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var21 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar17)->contextMap)._M_t._M_impl;
    p_Stack_1a0 = (_Base_ptr)0x1072d4;
    this_00 = (HtmlparserCppTest *)strtol((char *)p_Var21,&pcStack_198,10);
    puVar17 = (undefined1 *)pHVar5;
    if (*pcStack_198 == '\0') {
      bVar3 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)&pcStack_198;
    }
    else {
      bVar3 = false;
      unaff_R12 = (_Base_ptr)&pcStack_198;
    }
  }
  if (bVar3) {
    p_Var21 = p_Var20[1]._M_left;
    p_Stack_1a0 = (_Base_ptr)0x1072fc;
    iVar4 = ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)p_Var21);
    if ((int)this_00 == iVar4) {
      return;
    }
  }
  else {
    p_Stack_1a0 = (_Base_ptr)0x107312;
    ValidateLine();
  }
  p_Stack_1a0 = (_Base_ptr)0x107317;
  ValidateLine();
  pHVar18 = (HtmlparserCppTest *)auStack_1c0;
  auStack_1c0._8_8_ = p_Var20;
  p_Stack_1b0 = unaff_R12;
  pHStack_1a8 = this_00;
  p_Stack_1a0 = unaff_R15;
  if (*(long *)&(((HtmlparserCppTest *)puVar17)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar3 = false;
    p_Var20 = p_Var21;
  }
  else {
    p_Stack_1c8 = (_Base_ptr)0x107332;
    auStack_1c0._0_8_ = extraout_RAX_00;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var20 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar17)->contextMap)._M_t._M_impl;
    p_Stack_1c8 = (_Base_ptr)0x10734e;
    this_00 = (HtmlparserCppTest *)strtol((char *)p_Var20,(char **)auStack_1c0,10);
    puVar17 = (undefined1 *)pHVar18;
    if (*(char *)auStack_1c0._0_8_ == '\0') {
      bVar3 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)auStack_1c0;
    }
    else {
      bVar3 = false;
      unaff_R12 = (_Base_ptr)auStack_1c0;
    }
  }
  if (bVar3) {
    p_Var20 = p_Var21[1]._M_left;
    p_Stack_1c8 = (_Base_ptr)0x107376;
    iVar4 = ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)p_Var20);
    if ((int)this_00 == iVar4) {
      return;
    }
  }
  else {
    p_Stack_1c8 = (_Base_ptr)0x10738c;
    ValidateColumn();
  }
  p_Stack_1c8 = (_Base_ptr)0x107391;
  ValidateColumn();
  pHVar18 = (HtmlparserCppTest *)auStack_1e8;
  auStack_1e8._8_8_ = p_Var21;
  p_Stack_1d8 = unaff_R12;
  pHStack_1d0 = this_00;
  p_Stack_1c8 = unaff_R15;
  if (*(long *)&(((HtmlparserCppTest *)puVar17)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar3 = false;
    p_Var21 = p_Var20;
  }
  else {
    auStack_1e8._0_8_ = extraout_RAX_01;
    piVar10 = __errno_location();
    *piVar10 = 0;
    p_Var21 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar17)->contextMap)._M_t._M_impl;
    this_00 = (HtmlparserCppTest *)strtol((char *)p_Var21,(char **)auStack_1e8,10);
    puVar17 = (undefined1 *)pHVar18;
    if (*(char *)auStack_1e8._0_8_ == '\0') {
      bVar3 = *piVar10 == 0;
      unaff_R12 = (_Base_ptr)auStack_1e8;
    }
    else {
      bVar3 = false;
      unaff_R12 = (_Base_ptr)auStack_1e8;
    }
  }
  if (bVar3) {
    p_Var21 = p_Var20[1]._M_left;
    iVar4 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)p_Var21);
    if ((int)this_00 == iVar4) {
      return;
    }
  }
  else {
    ValidateValueIndex();
  }
  ValidateValueIndex();
  bVar3 = StringToBool((string *)puVar17);
  pHVar18 = (HtmlparserCppTest *)p_Var21[1]._M_left;
  iVar4 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar18);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateIsUrlStart();
  vStack_248.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_248.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_248.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Stack_230 = p_Var21;
  p_Stack_228 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)puVar17,"=",",",&vStack_248);
  if (vStack_248.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_248.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(pHVar18->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_248.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar4 = std::__cxx11::string::compare((char *)str_00);
      if (iVar4 == 0) {
        ValidateState(pHVar18,str);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)str_00);
        if (iVar4 == 0) {
          ValidateTag(pHVar18,str);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)str_00);
          if (iVar4 == 0) {
            ValidateAttribute(pHVar18,str);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)str_00);
            if (iVar4 == 0) {
              ValidateValue(pHVar18,str);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)str_00);
              if (iVar4 == 0) {
                ValidateAttributeType(pHVar18,str);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)str_00);
                if (iVar4 == 0) {
                  ValidateAttributeQuoted(pHVar18,str);
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar4 == 0) {
                    ValidateInJavascript(pHVar18,str);
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar4 == 0) {
                      ValidateJavascriptQuoted(pHVar18,str);
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar4 == 0) {
                        ValidateJavascriptState(pHVar18,str);
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar4 == 0) {
                          ValidateInCss(pHVar18,str);
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar4 == 0) {
                            ValidateLine(pHVar18,str);
                          }
                          else {
                            iVar4 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar4 == 0) {
                              ValidateColumn(pHVar18,str);
                            }
                            else {
                              iVar4 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar4 == 0) {
                                ValidateValueIndex(pHVar18,str);
                              }
                              else {
                                iVar4 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar4 == 0) {
                                  ValidateIsUrlStart(pHVar18,str);
                                }
                                else {
                                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar4 == 0) {
                                    cVar11 = std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                             ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar18,str);
                                    if ((_Rb_tree_header *)cVar11._M_node == p_Var1) {
                                      this_01 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_01);
                                      ppHVar12 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar18->contextMap,str);
                                      *ppHVar12 = this_01;
                                    }
                                    ppHVar12 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::operator[](&pHVar18->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar12,&pHVar18->parser_);
                                  }
                                  else {
                                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar4 == 0) {
                                      cVar11 = std::
                                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar18,str);
                                      if ((_Rb_tree_header *)cVar11._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_0010784b:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_248);
                                        _Unwind_Resume(extraout_RAX_02);
                                      }
                                      ppHVar12 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar18->contextMap,str);
                                      HtmlParser::CopyFrom(&pHVar18->parser_,*ppHVar12);
                                    }
                                    else {
                                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar4 == 0) {
                                        bVar3 = StringToBool(str);
                                        if (bVar3) {
                                          ctemplate_htmlparser::htmlparser_reset
                                                    ((pHVar18->parser_).parser_);
                                        }
                                      }
                                      else {
                                        this_02 = str_00;
                                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar4 == 0) {
                                          iVar4 = NameToId((HtmlparserCppTest *)this_02,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    ((pHVar18->parser_).parser_,iVar4);
                                        }
                                        else {
                                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar4 != 0) goto LAB_0010784b;
                                          bVar3 = StringToBool(str);
                                          if (bVar3) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      ((pHVar18->parser_).parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_248.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_248);
  return;
}

Assistant:

void HtmlparserCppTest::ValidateState(const string &expected_state) {
  const char* parsed_state = IdToName(kStateMap, parser_.state());
  EXPECT_TRUE(parsed_state != NULL);
  EXPECT_TRUE(!expected_state.empty());
  EXPECT_EQ(expected_state, string(parsed_state))
      << "Unexpected state at line " << parser_.line_number();
}